

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O0

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::min_buckets_for_size
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,size_t size)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  unsigned_long uVar3;
  double in_RSI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_RSI);
  auVar4._0_8_ = auVar1._0_8_ / (double)*(float *)(in_RDI + 0x18);
  auVar4._8_8_ = auVar1._8_8_;
  vroundsd_avx(auVar1,auVar4,9);
  sVar2 = double_to_size(in_RSI);
  uVar3 = mix64_policy<unsigned_long>::new_bucket_count(sVar2 + 1);
  return uVar3;
}

Assistant:

std::size_t min_buckets_for_size(std::size_t size) const
        {
            BOOST_ASSERT(mlf_ >= minimum_max_load_factor);
    
            using namespace std;
    
            // From 6.3.1/13:
            // size < mlf_ * count
            // => count > size / mlf_
            //
            // Or from rehash post-condition:
            // count > size / mlf_

            return policy::new_bucket_count(
                boost::unordered::detail::double_to_size(floor(
                    static_cast<double>(size) /
                    static_cast<double>(mlf_))) + 1);
        }